

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

bool __thiscall
flatbuffers::csharp::CSharpGenerator::SaveType
          (CSharpGenerator *this,string *defname,Namespace *ns,string *classcode,bool needs_includes
          ,IDLOptions *options)

{
  bool bVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string namespace_name;
  string code;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (classcode->_M_string_length == 0) {
    bVar1 = true;
  }
  else {
    __s = BaseGenerator::FlatBuffersGeneratedWarning();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,(allocator<char> *)&local_b0);
    std::operator+(&local_70,"// <auto-generated>\n//  ",&local_90);
    std::operator+(&local_50,&local_70,"\n// </auto-generated>\n\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    BaseGenerator::FullNamespace_abi_cxx11_
              (&local_70,(BaseGenerator *)0x280cfe,(char *)ns,(Namespace *)classcode);
    if (local_70._M_string_length != 0) {
      std::operator+(&local_b0,"namespace ",&local_70);
      std::operator+(&local_90,&local_b0,"\n{\n\n");
      std::__cxx11::string::append((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (needs_includes) {
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
    }
    std::__cxx11::string::append((string *)&local_50);
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_50);
    }
    BaseGenerator::NamespaceDir_abi_cxx11_(&local_b0,&this->super_BaseGenerator,ns,false);
    std::operator+(&local_90,&local_b0,defname);
    std::__cxx11::string::~string((string *)&local_b0);
    if (options->one_file == true) {
      std::__cxx11::string::append((string *)&local_90);
    }
    if ((options->filename_extension)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,".cs",&local_b1);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,(string *)&options->filename_extension);
    }
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar1 = SaveFile(local_90._M_dataplus._M_p,&local_50,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return bVar1;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes,
                const IDLOptions &options) const {
    if (!classcode.length()) return true;

    std::string code =
        "// <auto-generated>\n"
        "//  " +
        std::string(FlatBuffersGeneratedWarning()) +
        "\n"
        "// </auto-generated>\n\n";

    std::string namespace_name = FullNamespace(".", ns);
    if (!namespace_name.empty()) {
      code += "namespace " + namespace_name + "\n{\n\n";
    }
    if (needs_includes) {
      code += "using global::System;\n";
      code += "using global::System.Collections.Generic;\n";
      code += "using global::Google.FlatBuffers;\n\n";
    }
    code += classcode;
    if (!namespace_name.empty()) { code += "\n}\n"; }
    auto filename = NamespaceDir(ns) + defname;
    if (options.one_file) { filename += options.filename_suffix; }
    filename +=
        options.filename_extension.empty() ? ".cs" : options.filename_extension;
    return SaveFile(filename.c_str(), code, false);
  }